

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForeachLoopListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForeachLoopListSyntax,slang::parsing::Token&,slang::syntax::NameSyntax&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,NameSyntax *args_1,Token *args_2,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *args_3,Token *args_4,Token *args_5)

{
  Token openBracket;
  Token openParen;
  Token closeBracket;
  Token closeParen;
  ForeachLoopListSyntax *pFVar1;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  undefined8 in_RDI;
  Info *in_R9;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  BumpAllocator *in_stack_ffffffffffffff78;
  
  pFVar1 = (ForeachLoopListSyntax *)
           allocate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  openParen.info = in_R9;
  openParen._0_8_ = in_RSI->location;
  openBracket.info = (Info *)in_RSI->rawTextPtr;
  openBracket._0_8_ = *(undefined8 *)&(in_RCX->super_SyntaxListBase).super_SyntaxNode;
  closeBracket.info = in_RSI;
  closeBracket.kind = (short)in_RDX;
  closeBracket._2_1_ = (char)((ulong)in_RDX >> 0x10);
  closeBracket.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  closeBracket.rawLen = (int)((ulong)in_RDX >> 0x20);
  closeParen.info = unaff_retaddr;
  closeParen.kind = (short)in_RDI;
  closeParen._2_1_ = (char)((ulong)in_RDI >> 0x10);
  closeParen.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  closeParen.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::ForeachLoopListSyntax::ForeachLoopListSyntax
            ((ForeachLoopListSyntax *)(in_RCX->super_SyntaxListBase)._vptr_SyntaxListBase,openParen,
             (NameSyntax *)in_R9->location,openBracket,in_RCX,closeBracket,closeParen);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }